

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>_>,_8UL>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>>,8ul>>
::
emplace_new_key<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>>
          (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>>,8ul>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,
          pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
          *key)

{
  PortInfo *pPVar1;
  char cVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  size_t sVar5;
  char *pcVar6;
  DeclaratorSyntax *pDVar7;
  pointer ppAVar8;
  size_type sVar9;
  Symbol *pSVar10;
  Definition *pDVar11;
  not_null<const_slang::syntax::DeclaratorSyntax_*> nVar12;
  undefined6 uVar13;
  undefined2 uVar14;
  undefined6 uVar15;
  undefined2 uVar16;
  undefined6 uVar17;
  long lVar18;
  value_type *pvVar19;
  value_type *pvVar20;
  EntryPointer psVar21;
  anon_union_80_1_a8c68091_for_sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>_>_3
  *paVar22;
  char __tmp;
  EntryPointer psVar23;
  char __tmp_3;
  sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>>,8ul>>
  sVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>_>,_8UL>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>_>,_bool>
  pVar27;
  basic_string_view<char,_std::char_traits<char>_> __tmp_1;
  value_type to_insert;
  
  if ((*(long *)(this + 0x10) != 0) &&
     (this[0x19] !=
      (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>>,8ul>>
       )distance_from_desired)) {
    pvVar19 = (value_type *)(*(long *)(this + 0x20) + 1);
    auVar25._8_4_ = (int)((ulong)pvVar19 >> 0x20);
    auVar25._0_8_ = pvVar19;
    auVar25._12_4_ = 0x45300000;
    lVar18 = *(long *)(this + 0x10) + 1;
    auVar26._8_4_ = (int)((ulong)lVar18 >> 0x20);
    auVar26._0_8_ = lVar18;
    auVar26._12_4_ = 0x45300000;
    if ((auVar25._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)pvVar19) - 4503599627370496.0) <=
        (double)*(float *)(this + 0x1c) *
        ((auVar26._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar18) - 4503599627370496.0))) {
      cVar2 = current_entry->distance_from_desired;
      if (cVar2 < '\0') {
        paVar22 = &current_entry->field_1;
        for (lVar18 = 10; lVar18 != 0; lVar18 = lVar18 + -1) {
          (paVar22->value).first._M_len = (key->first)._M_len;
          key = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                 *)&(key->first)._M_str;
          paVar22 = (anon_union_80_1_a8c68091_for_sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>_>_3
                     *)((long)paVar22 + 8);
        }
        current_entry->distance_from_desired = distance_from_desired;
      }
      else {
        pvVar19 = &to_insert;
        pvVar20 = pvVar19;
        for (lVar18 = 10; uVar15 = to_insert.second._56_6_,
            uVar16 = to_insert.second.modport._M_str._6_2_,
            uVar13 = to_insert.second.modport._M_str._0_6_,
            uVar14 = to_insert.second.modport._M_len._6_2_, pDVar11 = to_insert.second.ifaceDef,
            pSVar10 = to_insert.second.internalSymbol, sVar9 = to_insert.second.attrs.size_,
            ppAVar8 = to_insert.second.attrs.data_, nVar12.ptr = to_insert.second.syntax.ptr,
            pcVar6 = to_insert.first._M_str, sVar5 = to_insert.first._M_len, lVar18 != 0;
            lVar18 = lVar18 + -1) {
          (pvVar20->first)._M_len = (key->first)._M_len;
          key = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                 *)&(key->first)._M_str;
          pvVar20 = (value_type *)&(pvVar20->first)._M_str;
        }
        current_entry->distance_from_desired = distance_from_desired;
        to_insert.first._M_len = (current_entry->field_1).value.first._M_len;
        to_insert.first._M_str = (current_entry->field_1).value.first._M_str;
        (current_entry->field_1).value.first._M_len = sVar5;
        (current_entry->field_1).value.first._M_str = pcVar6;
        pPVar1 = &(current_entry->field_1).value.second;
        sVar5 = CONCAT26(to_insert.second.modport._M_len._6_2_,
                         (undefined6)to_insert.second.modport._M_len);
        uVar3 = *(undefined8 *)((long)&current_entry->field_1 + 0x38);
        uVar4 = *(undefined8 *)((long)&current_entry->field_1 + 0x46);
        to_insert.second.modport._M_str._0_6_ =
             (undefined6)((ulong)*(undefined8 *)((long)&current_entry->field_1 + 0x3e) >> 0x10);
        to_insert.second.modport._M_str._6_2_ = (undefined2)uVar4;
        to_insert.second._56_6_ = SUB86((ulong)uVar4 >> 0x10,0);
        to_insert.second.ifaceDef = (current_entry->field_1).value.second.ifaceDef;
        to_insert.second.modport._M_len._0_6_ = (undefined6)uVar3;
        to_insert.second.modport._M_len._6_2_ = (undefined2)((ulong)uVar3 >> 0x30);
        to_insert.second.attrs.size_ = (current_entry->field_1).value.second.attrs.size_;
        to_insert.second.internalSymbol = (current_entry->field_1).value.second.internalSymbol;
        to_insert.second.syntax.ptr = (current_entry->field_1).value.second.syntax.ptr;
        to_insert.second.attrs.data_ = (current_entry->field_1).value.second.attrs.data_;
        *(ulong *)((long)&(current_entry->field_1).value.second.modport._M_len + 6) =
             CONCAT62(uVar13,uVar14);
        *(ulong *)((long)&(current_entry->field_1).value.second.modport._M_str + 6) =
             CONCAT62(uVar15,uVar16);
        (current_entry->field_1).value.second.ifaceDef = pDVar11;
        (current_entry->field_1).value.second.modport._M_len = sVar5;
        (current_entry->field_1).value.second.attrs.size_ = sVar9;
        (current_entry->field_1).value.second.internalSymbol = pSVar10;
        (current_entry->field_1).value.second.syntax.ptr = nVar12.ptr;
        (current_entry->field_1).value.second.attrs.data_ = ppAVar8;
        sVar24 = (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>>,8ul>>
                  )(cVar2 + '\x01');
        for (psVar23 = current_entry + 1; uVar17 = to_insert.second._56_6_,
            uVar16 = to_insert.second.modport._M_str._6_2_,
            uVar15 = to_insert.second.modport._M_str._0_6_,
            uVar14 = to_insert.second.modport._M_len._6_2_,
            uVar13 = (undefined6)to_insert.second.modport._M_len,
            pDVar11 = to_insert.second.ifaceDef, pSVar10 = to_insert.second.internalSymbol,
            sVar9 = to_insert.second.attrs.size_, ppAVar8 = to_insert.second.attrs.data_,
            nVar12.ptr = to_insert.second.syntax.ptr, pcVar6 = to_insert.first._M_str,
            sVar5 = to_insert.first._M_len, cVar2 = psVar23->distance_from_desired, -1 < cVar2;
            psVar23 = psVar23 + 1) {
          if (cVar2 < (char)sVar24) {
            psVar23->distance_from_desired = (int8_t)sVar24;
            to_insert.first._M_len = (psVar23->field_1).value.first._M_len;
            to_insert.first._M_str = (psVar23->field_1).value.first._M_str;
            (psVar23->field_1).value.first._M_len = sVar5;
            (psVar23->field_1).value.first._M_str = pcVar6;
            uVar3 = *(undefined8 *)((long)&psVar23->field_1 + 0x38);
            uVar4 = *(undefined8 *)((long)&psVar23->field_1 + 0x46);
            to_insert.second.modport._M_str._0_6_ =
                 (undefined6)((ulong)*(undefined8 *)((long)&psVar23->field_1 + 0x3e) >> 0x10);
            to_insert.second.modport._M_str._6_2_ = (undefined2)uVar4;
            to_insert.second._56_6_ = SUB86((ulong)uVar4 >> 0x10,0);
            to_insert.second.ifaceDef = (psVar23->field_1).value.second.ifaceDef;
            to_insert.second.modport._M_len._0_6_ = (undefined6)uVar3;
            to_insert.second.modport._M_len._6_2_ = (undefined2)((ulong)uVar3 >> 0x30);
            to_insert.second.attrs.size_ = (psVar23->field_1).value.second.attrs.size_;
            to_insert.second.internalSymbol = (psVar23->field_1).value.second.internalSymbol;
            to_insert.second.syntax.ptr = (psVar23->field_1).value.second.syntax.ptr;
            to_insert.second.attrs.data_ = (psVar23->field_1).value.second.attrs.data_;
            *(ulong *)((long)&(psVar23->field_1).value.second.modport._M_len + 6) =
                 CONCAT62(uVar15,uVar14);
            *(ulong *)((long)&(psVar23->field_1).value.second.modport._M_str + 6) =
                 CONCAT62(uVar17,uVar16);
            (psVar23->field_1).value.second.ifaceDef = pDVar11;
            (psVar23->field_1).value.second.modport._M_len = CONCAT26(uVar14,uVar13);
            (psVar23->field_1).value.second.attrs.size_ = sVar9;
            (psVar23->field_1).value.second.internalSymbol = pSVar10;
            (psVar23->field_1).value.second.syntax.ptr = nVar12.ptr;
            (psVar23->field_1).value.second.attrs.data_ = ppAVar8;
            sVar24 = (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>>,8ul>>
                      )(cVar2 + '\x01');
          }
          else {
            sVar24 = (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>>,8ul>>
                      )((char)sVar24 + '\x01');
            if (sVar24 == this[0x19]) {
              key = &to_insert;
              sVar5 = (current_entry->field_1).value.first._M_len;
              pcVar6 = (current_entry->field_1).value.first._M_str;
              (current_entry->field_1).value.first._M_len = to_insert.first._M_len;
              (current_entry->field_1).value.first._M_str = to_insert.first._M_str;
              pDVar7 = (pPVar1->syntax).ptr;
              ppAVar8 = (current_entry->field_1).value.second.attrs.data_;
              sVar9 = (current_entry->field_1).value.second.attrs.size_;
              pSVar10 = (current_entry->field_1).value.second.internalSymbol;
              pDVar11 = (current_entry->field_1).value.second.ifaceDef;
              uVar3 = *(undefined8 *)((long)&current_entry->field_1 + 0x38);
              uVar4 = *(undefined8 *)((long)&current_entry->field_1 + 0x46);
              to_insert.second.modport._M_str._0_6_ =
                   (undefined6)
                   ((ulong)*(undefined8 *)((long)&current_entry->field_1 + 0x3e) >> 0x10);
              to_insert.second.modport._M_str._6_2_ = (undefined2)uVar4;
              to_insert.second._56_6_ = SUB86((ulong)uVar4 >> 0x10,0);
              to_insert.second.modport._M_len._0_6_ = (undefined6)uVar3;
              to_insert.second.modport._M_len._6_2_ = (undefined2)((ulong)uVar3 >> 0x30);
              (current_entry->field_1).value.second.ifaceDef = to_insert.second.ifaceDef;
              (current_entry->field_1).value.second.modport._M_len = CONCAT26(uVar14,uVar13);
              *(ulong *)((long)&(current_entry->field_1).value.second.modport._M_len + 6) =
                   CONCAT62(uVar15,uVar14);
              *(ulong *)((long)&(current_entry->field_1).value.second.modport._M_str + 6) =
                   CONCAT62(uVar17,uVar16);
              (current_entry->field_1).value.second.attrs.size_ = to_insert.second.attrs.size_;
              (current_entry->field_1).value.second.internalSymbol = to_insert.second.internalSymbol
              ;
              (pPVar1->syntax).ptr = to_insert.second.syntax.ptr;
              (current_entry->field_1).value.second.attrs.data_ = to_insert.second.attrs.data_;
              to_insert.first._M_len = sVar5;
              to_insert.first._M_str = pcVar6;
              to_insert.second.syntax.ptr = pDVar7;
              to_insert.second.attrs.data_ = ppAVar8;
              to_insert.second.attrs.size_ = sVar9;
              to_insert.second.internalSymbol = pSVar10;
              to_insert.second.ifaceDef = pDVar11;
              goto LAB_001bb06a;
            }
          }
        }
        pvVar20 = &to_insert;
        psVar21 = psVar23;
        for (lVar18 = 10; psVar21 = (EntryPointer)&psVar21->field_1, lVar18 != 0;
            lVar18 = lVar18 + -1) {
          (((pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
             *)psVar21)->first)._M_len = (pvVar20->first)._M_len;
          pvVar20 = (value_type *)&(pvVar20->first)._M_str;
        }
        psVar23->distance_from_desired = (int8_t)sVar24;
      }
      *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
      pVar27._9_7_ = (int7)((ulong)pvVar19 >> 8);
      pVar27.second = true;
      pVar27.first.current = current_entry;
      return pVar27;
    }
  }
LAB_001bb06a:
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>_>,_8UL>_>
  ::grow((sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>_>,_8UL>_>
          *)this);
  pVar27 = emplace<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>>
                     (this,key);
  return pVar27;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }